

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test.hpp
# Opt level: O0

void nestl::test::CheckListSize<nestl::has_exceptions::list<int,nestl::allocator<int>>>
               (list<int,_nestl::allocator<int>_> *l,size_t expectedSize)

{
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  size_type local_48;
  size_t cdist;
  list_const_iterator<int> local_38;
  size_type local_30;
  size_t dist;
  bool listIsEmpty;
  size_type sStack_20;
  bool shouldBeEmpty;
  size_type local_18;
  size_t expectedSize_local;
  list<int,_nestl::allocator<int>_> *l_local;
  
  local_18 = expectedSize;
  expectedSize_local = (size_t)l;
  sVar1 = impl::list<int,_nestl::allocator<int>_>::size(&l->super_list<int,_nestl::allocator<int>_>)
  ;
  if (sVar1 != local_18) {
    sStack_20 = impl::list<int,_nestl::allocator<int>_>::size
                          ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
    fatal_failure<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((char (*) [16])"expected size: ",&local_18,(char (*) [8])", got: ",
               &stack0xffffffffffffffe0);
  }
  dist._7_1_ = local_18 == 0;
  dist._6_1_ = impl::list<int,_nestl::allocator<int>_>::empty
                         ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
  if (dist._6_1_ != (dist._7_1_ & 1)) {
    fatal_failure<char_const(&)[27],bool&,char_const(&)[22],bool&>
              ((char (*) [27])"list empty method returns ",(bool *)((long)&dist + 6),
               (char (*) [22])", while it should be ",(bool *)((long)&dist + 7));
  }
  local_38.m_node =
       (list_node_base *)
       impl::list<int,_nestl::allocator<int>_>::begin
                 ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
  cdist = (size_t)impl::list<int,_nestl::allocator<int>_>::end
                            ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
  local_30 = std::distance<nestl::impl::list_const_iterator<int>>
                       (local_38,(list_const_iterator<int>)cdist);
  if (local_30 != local_18) {
    fatal_failure<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [38])"distance between iterators should be ",&local_18,
               (char (*) [16])" elements, got ",&local_30,(char (*) [10])" elements");
  }
  __first = impl::list<int,_nestl::allocator<int>_>::cbegin
                      ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
  __last = impl::list<int,_nestl::allocator<int>_>::cend
                     ((list<int,_nestl::allocator<int>_> *)expectedSize_local);
  local_48 = std::distance<nestl::impl::list_const_iterator<int>>
                       ((list_const_iterator<int>)__first.m_node,
                        (list_const_iterator<int>)__last.m_node);
  if (local_48 != local_18) {
    fatal_failure<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [44])"distance between const iterators should be ",&local_18,
               (char (*) [16])" elements, got ",&local_48,(char (*) [10])" elements");
  }
  return;
}

Assistant:

void CheckListSize(const List& l, size_t expectedSize)
{
    if (l.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", l.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool listIsEmpty = l.empty();

    if (listIsEmpty != shouldBeEmpty)
    {
        fatal_failure("list empty method returns ", listIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(l.begin(), l.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(l.cbegin(), l.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be ", expectedSize, " elements, got ", cdist, " elements");
    }
}